

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectionParserManager.cpp
# Opt level: O0

void __thiscall
OpenMD::SectionParserManager::push_front(SectionParserManager *this,SectionParser *sp)

{
  bool bVar1;
  string *psVar2;
  ostream *poVar3;
  SectionParser *in_RSI;
  fpos<__mbstate_t> *in_RDI;
  SectionParserContext context;
  iterator i;
  list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
  *in_stack_ffffffffffffff88;
  value_type *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  _Self local_28;
  _List_node_base *local_20;
  _List_iterator<OpenMD::SectionParserContext> local_18;
  SectionParser *local_10;
  
  local_10 = in_RSI;
  std::_List_iterator<OpenMD::SectionParserContext>::_List_iterator(&local_18);
  SectionParser::getSectionName_abi_cxx11_(local_10);
  local_20 = (_List_node_base *)
             findSectionParser((SectionParserManager *)
                               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                               in_stack_ffffffffffffffa0);
  local_18._M_node = local_20;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>::end
                 (in_stack_ffffffffffffff88);
  bVar1 = std::operator!=(&local_18,&local_28);
  if (bVar1) {
    psVar2 = SectionParser::getSectionName_abi_cxx11_(local_10);
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)psVar2);
    poVar3 = std::operator<<(poVar3," section parser already exists");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    SectionParserContext::SectionParserContext((SectionParserContext *)0x285046);
    bVar1 = std::__cxx11::
            list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>::empty
                      ((list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
                        *)&in_RDI->_M_state);
    if (!bVar1) {
      std::__cxx11::
      list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>::front
                ((list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
                  *)in_RDI);
    }
    std::fpos<__mbstate_t>::fpos(in_RDI,(streamoff)in_stack_ffffffffffffff88);
    std::__cxx11::list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
    ::push_front((list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
                  *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  return;
}

Assistant:

void SectionParserManager::push_front(SectionParser* sp) {
    SectionParserManager::iterator i;
    i = findSectionParser(sp->getSectionName());
    if (i != sectionParsers_.end()) {
      std::cerr << sp->getSectionName() << " section parser already exists"
                << std::endl;
      return;
    }

    SectionParserContext context;

    if (sectionParsers_.empty()) {
      context.priority = beginPriority_;
    } else {
      context.priority = sectionParsers_.front().priority - priorityDifference_;
    }

    context.sectionParser = sp;
    context.lineNo        = 0;
    context.offset        = 0;
    context.isActive      = false;

    sectionParsers_.push_front(context);
  }